

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgqueue.c
# Opt level: O0

int nn_msgqueue_send(nn_msgqueue *self,nn_msg *msg)

{
  nn_msg *dst;
  size_t sVar1;
  void *pvVar2;
  long *in_RDI;
  bool bVar3;
  size_t msgsz;
  nn_msg *in_stack_ffffffffffffffc8;
  nn_chunkref *in_stack_ffffffffffffffd0;
  int local_4;
  
  dst = (nn_msg *)nn_chunkref_size(in_stack_ffffffffffffffd0);
  sVar1 = nn_chunkref_size((nn_chunkref *)dst);
  bVar3 = false;
  if (in_RDI[4] != 0) {
    bVar3 = (uint8_t *)in_RDI[6] <= (dst->sphdr).u.ref + in_RDI[5] + sVar1;
  }
  if (bVar3) {
    local_4 = -0xb;
  }
  else {
    in_RDI[4] = in_RDI[4] + 1;
    in_RDI[5] = (long)((dst->sphdr).u.ref + in_RDI[5] + sVar1);
    nn_msg_mv(dst,in_stack_ffffffffffffffc8);
    *(int *)(in_RDI + 1) = (int)in_RDI[1] + 1;
    if ((int)in_RDI[1] == 0x7e) {
      if (in_RDI[7] == 0) {
        pvVar2 = nn_alloc_(0x31cf03);
        in_RDI[7] = (long)pvVar2;
        if (in_RDI[7] == 0) {
          nn_backtrace_print();
          fprintf(_stderr,"Out of memory (%s:%d)\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/inproc/msgqueue.c"
                  ,0x69);
          fflush(_stderr);
          nn_err_abort();
        }
        *(undefined8 *)(in_RDI[7] + 0x2f40) = 0;
      }
      *(long *)(*in_RDI + 0x2f40) = in_RDI[7];
      *in_RDI = in_RDI[7];
      in_RDI[7] = 0;
      *(undefined4 *)(in_RDI + 1) = 0;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int nn_msgqueue_send (struct nn_msgqueue *self, struct nn_msg *msg)
{
    size_t msgsz;

    /*  By allowing one message of arbitrary size to be written to the queue,
        we allow even messages that exceed max buffer size to pass through.
        Beyond that we'll apply the buffer limit as specified by the user. */
    msgsz = nn_chunkref_size (&msg->sphdr) + nn_chunkref_size (&msg->body);
    if (nn_slow (self->count > 0 && self->mem + msgsz >= self->maxmem))
        return -EAGAIN;

    /*  Adjust the statistics. */
    ++self->count;
    self->mem += msgsz;

    /*  Move the content of the message to the pipe. */
    nn_msg_mv (&self->out.chunk->msgs [self->out.pos], msg);
    ++self->out.pos;

    /*  If there's no space for a new message in the pipe, either re-use
        the cache chunk or allocate a new chunk if it does not exist. */
    if (nn_slow (self->out.pos == NN_MSGQUEUE_GRANULARITY)) {
        if (nn_slow (!self->cache)) {
            self->cache = nn_alloc (sizeof (struct nn_msgqueue_chunk),
                "msgqueue chunk");
            alloc_assert (self->cache);
            self->cache->next = NULL;
        }
        self->out.chunk->next = self->cache;
        self->out.chunk = self->cache;
        self->cache = NULL;
        self->out.pos = 0;
    }

    return 0;
}